

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void * region_join(region *region,size_t size)

{
  small_stats *psVar1;
  rlist *prVar2;
  uint __line;
  int iVar3;
  void *__dest;
  void *pvVar4;
  ulong __n;
  char *__assertion;
  rlist *prVar5;
  ulong __n_00;
  
  if ((region->slabs).stats.used < size) {
    __assertion = "size <= region_used(region)";
    __line = 0x71;
  }
  else if (region->reserved == 0) {
    if (size != 0) {
      prVar5 = (region->slabs).slabs.next;
      if (*(uint *)&prVar5[2].prev < size) {
        __dest = region_reserve(region,size);
        __n_00 = size;
        if (__dest == (void *)0x0) {
          __dest = (void *)0x0;
        }
        else {
          for (; __n_00 != 0; __n_00 = __n_00 - *(uint *)&prVar2->prev) {
            __n = (ulong)*(uint *)&prVar5[2].prev;
            if (__n_00 < __n) {
              memcpy(__dest,(void *)((long)prVar5 + (__n - __n_00) + 0x28),__n_00);
              break;
            }
            memcpy((void *)((long)__dest + (__n_00 - __n)),&prVar5[2].next,__n);
            prVar2 = prVar5 + 2;
            prVar5 = prVar5->next;
          }
          region->reserved = 0;
          pvVar4 = region_reserve(region,size);
          if (pvVar4 != (void *)0x0) {
            prVar5 = (region->slabs).slabs.next;
            iVar3 = *(int *)&prVar5[2].prev;
            if ((*(int *)&prVar5[1].prev - iVar3) - 0x38 < size) {
              __assert_fail("size <= rslab_unused(slab)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                            ,0xf8,"void *region_alloc(struct region *, size_t)");
            }
            if (region->on_alloc_cb != (region_on_alloc_f)0x0) {
              (*region->on_alloc_cb)(region,size,region->cb_arg);
              iVar3 = *(int *)&prVar5[2].prev;
            }
            psVar1 = &(region->slabs).stats;
            psVar1->used = psVar1->used + size;
            *(int *)&prVar5[2].prev = (int)size + iVar3;
            region->reserved = 0;
          }
        }
      }
      else {
        __dest = (void *)((long)prVar5 + (*(uint *)&prVar5[2].prev - size) + 0x28);
      }
      return __dest;
    }
    __assertion = "size > 0";
    __line = 0x73;
  }
  else {
    __assertion = "!region->reserved";
    __line = 0x72;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                ,__line,"void *region_join(struct region *, size_t)");
}

Assistant:

void *
region_join(struct region *region, size_t size)
{
	assert(size <= region_used(region));
	assert(!region->reserved);
	assert(size > 0);
	struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
					       struct rslab,
					       slab.next_in_list);

	if (slab->used >= size) {
		/* Don't move stuff if it's in a single chunk. */
		return (char *) rslab_data(slab) + slab->used - size;
	}
	/**
	 * Use region_reserve() to ensure slab->size is not
	 * changed when the joined region is in the same slab
	 * as the final chunk.
	 */
	char *ptr = region_reserve(region, size);
	size_t offset = size;
	if (ptr == NULL)
		return NULL;
	/*
	 * Copy data from last chunk to first, i.e. in the reverse order.
	 */
	while (offset > 0 && slab->used <= offset) {
		memcpy(ptr + offset - slab->used, rslab_data(slab), slab->used);
		offset -= slab->used;
		slab = rlist_next_entry(slab, slab.next_in_list);
	}
	if (offset > 0)
		memcpy(ptr, rslab_data(slab) + slab->used - offset, offset);
	region_alloc(region, size);
	return ptr;
}